

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::push
          (stack<c4::yml::Parser::State,_16UL> *this,State *n)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sz;
  
  if ((this->m_stack <= n + 1) && (n <= this->m_stack + this->m_capacity)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_002867d8)
              ("check failed: (const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity"
               ,0x5d,(anonymous_namespace)::s_default_callbacks);
  }
  sVar3 = this->m_size;
  if (sVar3 == this->m_capacity) {
    sz = 0x10;
    if (sVar3 != 0) {
      sz = sVar3 * 2;
    }
    reserve(this,sz);
    sVar3 = this->m_size;
  }
  memcpy(this->m_stack + sVar3,n,0x98);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push(T const& C4_RESTRICT n)
    {
        RYML_ASSERT((const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity);
        if(m_size == m_capacity)
        {
            size_t cap = m_capacity == 0 ? N : 2 * m_capacity;
            reserve(cap);
        }
        m_stack[m_size] = n;
        ++m_size;
    }